

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

SettingsValue * __thiscall
ArgsManager::GetPersistentSetting
          (SettingsValue *__return_storage_ptr__,ArgsManager *this,string *name)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  unique_lock<std::recursive_mutex> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_owns = false;
  local_50._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_50);
  std::operator+(&local_40,"-",name);
  bVar1 = UseDefaultSection(this,&local_40);
  common::GetSetting(__return_storage_ptr__,&this->m_settings,&this->m_network,name,!bVar1,true,
                     false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

common::SettingsValue ArgsManager::GetPersistentSetting(const std::string& name) const
{
    LOCK(cs_args);
    return common::GetSetting(m_settings, m_network, name, !UseDefaultSection("-" + name),
        /*ignore_nonpersistent=*/true, /*get_chain_type=*/false);
}